

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O0

Status __thiscall
sentencepiece::SentencePieceProcessor::NBestEncode
          (SentencePieceProcessor *this,string_view input,int nbest_size,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *pieces)

{
  bool bVar1;
  undefined1 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  in_RDI;
  undefined4 in_R8D;
  long in_R9;
  SentencePieceText_SentencePiece *sp;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  SentencePieceText *nbest;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<sentencepiece::SentencePieceText> *__range1;
  NBestSentencePieceText spt;
  Status *_status;
  undefined4 in_stack_fffffffffffffcc8;
  StatusCode in_stack_fffffffffffffccc;
  StatusBuilder *in_stack_fffffffffffffcd0;
  reference in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  StatusBuilder *in_stack_fffffffffffffd18;
  iterator local_268;
  RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece> local_260;
  RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece> *local_258;
  SentencePieceText *local_238;
  iterator local_230;
  RepeatedPtrIterator<const_sentencepiece::SentencePieceText> local_228;
  RepeatedPtrField<sentencepiece::SentencePieceText> *local_220;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  byte local_201;
  NBestSentencePieceText local_200;
  undefined4 local_1cc;
  uint local_48;
  byte local_31;
  long local_30;
  undefined4 local_24;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_31 = 0;
  local_30 = in_R9;
  local_24 = in_R8D;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  (**(code **)(*in_RSI + 0x38))
            (in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
  bVar1 = util::Status::ok((Status *)0x3df938);
  if (!bVar1) {
    local_31 = 1;
  }
  local_48 = (uint)!bVar1;
  if ((local_31 & 1) == 0) {
    util::Status::~Status((Status *)0x3df9ab);
  }
  if (local_48 == 0) {
    if (local_30 == 0) {
      util::StatusBuilder::StatusBuilder(in_stack_fffffffffffffcd0,in_stack_fffffffffffffccc);
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffcd0,
                 (char (*) [57])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffcd0,
                 (char (*) [2])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      local_1cc = 0x1b4;
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffcd0,
                 (int *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffcd0,
                 (char (*) [4])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffcd0,
                 (char (*) [7])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffcd0,
                 (char (*) [3])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      util::StatusBuilder::operator<<
                (in_stack_fffffffffffffcd0,
                 (char (*) [25])CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      util::StatusBuilder::operator_cast_to_Status(in_stack_fffffffffffffd18);
      util::StatusBuilder::~StatusBuilder((StatusBuilder *)0x3dfad9);
    }
    else {
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::clear((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)0x3dfb11);
      NBestSentencePieceText::NBestSentencePieceText((NBestSentencePieceText *)0x3dfb1e);
      local_201 = 0;
      local_218 = (undefined4)local_18;
      uStack_214 = local_18._4_4_;
      uStack_210 = (undefined4)uStack_10;
      uStack_20c = uStack_10._4_4_;
      (**(code **)(*in_RSI + 0xd0))
                (in_RDI._M_t.
                 super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                 .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl,
                 in_RSI,local_18,uStack_10,local_24,&local_200);
      bVar1 = util::Status::ok((Status *)0x3dfb81);
      if (!bVar1) {
        local_201 = 1;
      }
      local_48 = (uint)!bVar1;
      if ((local_201 & 1) == 0) {
        util::Status::~Status((Status *)0x3dfc07);
      }
      if (local_48 == 0) {
        local_220 = NBestSentencePieceText::nbests(&local_200);
        local_228.it_ =
             (void **)google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::begin
                                ((RepeatedPtrField<sentencepiece::SentencePieceText> *)
                                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        local_230.it_ =
             (void **)google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::end
                                ((RepeatedPtrField<sentencepiece::SentencePieceText> *)
                                 in_stack_fffffffffffffcd8);
        while (bVar1 = google::protobuf::internal::
                       RepeatedPtrIterator<const_sentencepiece::SentencePieceText>::operator!=
                                 (&local_228,&local_230), bVar1) {
          local_238 = google::protobuf::internal::
                      RepeatedPtrIterator<const_sentencepiece::SentencePieceText>::operator*
                                (&local_228);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x3dfcd5);
          local_258 = SentencePieceText::pieces(local_238);
          local_260.it_ =
               (void **)google::protobuf::
                        RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::begin
                                  ((RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>
                                    *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
          ;
          local_268.it_ =
               (void **)google::protobuf::
                        RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>::end
                                  ((RepeatedPtrField<sentencepiece::SentencePieceText_SentencePiece>
                                    *)in_stack_fffffffffffffcd8);
          while (uVar2 = google::protobuf::internal::
                         RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::
                         operator!=(&local_260,&local_268), (bool)uVar2) {
            in_stack_fffffffffffffcd8 =
                 google::protobuf::internal::
                 RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::
                 operator*(&local_260);
            in_stack_fffffffffffffcd0 =
                 (StatusBuilder *)
                 SentencePieceText_SentencePiece::piece_abi_cxx11_
                           ((SentencePieceText_SentencePiece *)0x3dfd8e);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(uVar2,in_stack_fffffffffffffce0),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcd8);
            google::protobuf::internal::
            RepeatedPtrIterator<const_sentencepiece::SentencePieceText_SentencePiece>::operator++
                      (&local_260);
          }
          std::
          vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    ((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)CONCAT17(uVar2,in_stack_fffffffffffffce0),
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffcd8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(uVar2,in_stack_fffffffffffffce0));
          google::protobuf::internal::RepeatedPtrIterator<const_sentencepiece::SentencePieceText>::
          operator++(&local_228);
        }
        util::OkStatus();
        local_48 = 1;
      }
      NBestSentencePieceText::~NBestSentencePieceText
                ((NBestSentencePieceText *)in_stack_fffffffffffffcd0);
    }
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceProcessor::NBestEncode(
    absl::string_view input, int nbest_size,
    std::vector<std::vector<std::string>> *pieces) const {
  CHECK_OR_RETURN_STATUS_STL(pieces);

  NBestSentencePieceText spt;
  RETURN_IF_ERROR(NBestEncode(input, nbest_size, &spt));
  for (const auto &nbest : spt.nbests()) {
    std::vector<std::string> result;
    for (const auto &sp : nbest.pieces()) {
      result.emplace_back(sp.piece());
    }
    pieces->emplace_back(result);
  }

  return util::OkStatus();
}